

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6246d::TestXmlTestReporterFixtureOneFailureAndOneSuccess::RunImpl
          (TestXmlTestReporterFixtureOneFailureAndOneSuccess *this)

{
  TestDetails *details;
  XmlTestReporterFixtureOneFailureAndOneSuccessHelper fixtureHelper;
  undefined1 auStack_1d8 [376];
  TestReporter local_60;
  vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_> local_58;
  TestDetails *local_38;
  
  details = &(this->super_Test).m_details;
  XmlTestReporterFixture::XmlTestReporterFixture((XmlTestReporterFixture *)auStack_1d8);
  local_38 = details;
  UnitTest::ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureOneFailureAndOneSuccessHelper>
            ((XmlTestReporterFixtureOneFailureAndOneSuccessHelper *)auStack_1d8,details);
  local_60._vptr_TestReporter = (_func_int **)&PTR__DeferredTestReporter_00152c28;
  std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::~vector
            (&local_58);
  UnitTest::TestReporter::~TestReporter(&local_60);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1d8);
  std::ios_base::~ios_base((ios_base *)(auStack_1d8 + 0x70));
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, OneFailureAndOneSuccess)
{
    TestDetails const failedDetails("FailedTest", "suite", "fail.h", 1);
    reporter.ReportTestStart(failedDetails);
    reporter.ReportFailure(failedDetails, "expected 1 but was 2");
    reporter.ReportTestFinish(failedDetails, 0.1f);

    TestDetails const succeededDetails("SucceededTest", "suite", "", 0);
    reporter.ReportTestStart(succeededDetails);
    reporter.ReportTestFinish(succeededDetails, 1.0f);
    reporter.ReportSummary(2, 1, 1, 1.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"2\" failedtests=\"1\" failures=\"1\" time=\"1.1\">"
        "<test suite=\"suite\" name=\"FailedTest\" time=\"0.1\">"
        "<failure message=\"fail.h(1) : expected 1 but was 2\"/>"
        "</test>"
        "<test suite=\"suite\" name=\"SucceededTest\" time=\"1\"/>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}